

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

void sysbvm_functionCallFrameStack_begin
               (sysbvm_context_t *context,sysbvm_functionCallFrameStack_t *callFrameStack,
               sysbvm_tuple_t function,size_t argumentCount,sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t variadicArgumentCount;
  size_t requiredArgumentCount;
  sysbvm_bitflags_t applicationFlags_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function_local;
  sysbvm_functionCallFrameStack_t *callFrameStack_local;
  sysbvm_context_t *context_local;
  
  (callFrameStack->gcRoots).function = function;
  _Var1 = sysbvm_function_isVariadic(context,(callFrameStack->gcRoots).function);
  callFrameStack->isVariadic = _Var1;
  _Var1 = sysbvm_function_isMemoizedTemplate(context,(callFrameStack->gcRoots).function);
  callFrameStack->isMemoizedTemplate = _Var1;
  callFrameStack->applicationFlags = applicationFlags;
  sVar2 = sysbvm_function_getArgumentCount(context,(callFrameStack->gcRoots).function);
  callFrameStack->expectedArgumentCount = sVar2;
  callFrameStack->argumentIndex = 0;
  callFrameStack->variadicArgumentIndex = 0;
  if ((applicationFlags & 3) != 0) {
    callFrameStack->isVariadic = false;
  }
  variadicArgumentCount = callFrameStack->expectedArgumentCount;
  if ((callFrameStack->isMemoizedTemplate & 1U) != 0) {
    if (callFrameStack->expectedArgumentCount == 0) {
      sysbvm_error("Memoized template function requires at least a single argument.");
    }
    callFrameStack->expectedArgumentCount = callFrameStack->expectedArgumentCount - 1;
    variadicArgumentCount = variadicArgumentCount - 1;
  }
  if ((callFrameStack->isVariadic & 1U) == 0) {
    if (argumentCount != variadicArgumentCount) {
      sysbvm_error("Function call does not receive the required number of arguments.");
    }
  }
  else {
    if (variadicArgumentCount == 0) {
      sysbvm_error("Variadic functions require at least a single argument.");
    }
    callFrameStack->variadicArgumentIndex = variadicArgumentCount - 1;
    if (argumentCount < variadicArgumentCount - 1) {
      sysbvm_error("Missing required argument count.");
    }
    sVar3 = sysbvm_array_create(context,argumentCount - (variadicArgumentCount - 1));
    (callFrameStack->gcRoots).applicationArguments[callFrameStack->variadicArgumentIndex] = sVar3;
  }
  if ((0x10 < argumentCount) && ((callFrameStack->isVariadic & 1U) == 0)) {
    sysbvm_error("Function application direct arguments exceeds the max argument count.");
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionCallFrameStack_begin(sysbvm_context_t *context, sysbvm_functionCallFrameStack_t *callFrameStack, sysbvm_tuple_t function, size_t argumentCount, sysbvm_bitflags_t applicationFlags)
{
    callFrameStack->gcRoots.function = function;
    callFrameStack->isVariadic = sysbvm_function_isVariadic(context, callFrameStack->gcRoots.function);
    callFrameStack->isMemoizedTemplate = sysbvm_function_isMemoizedTemplate(context, callFrameStack->gcRoots.function);
    callFrameStack->applicationFlags = applicationFlags;
    callFrameStack->expectedArgumentCount = sysbvm_function_getArgumentCount(context, callFrameStack->gcRoots.function);
    callFrameStack->argumentIndex = 0;
    callFrameStack->variadicArgumentIndex = 0;

    if(applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK))
        callFrameStack->isVariadic = false;

    size_t requiredArgumentCount = callFrameStack->expectedArgumentCount;
    if(callFrameStack->isMemoizedTemplate)
    {
        if(callFrameStack->expectedArgumentCount == 0)
            sysbvm_error("Memoized template function requires at least a single argument.");
        --callFrameStack->expectedArgumentCount;
        --requiredArgumentCount;
    }

    if(callFrameStack->isVariadic)
    {
        if(requiredArgumentCount == 0)
            sysbvm_error("Variadic functions require at least a single argument.");
        callFrameStack->variadicArgumentIndex = requiredArgumentCount - 1;

        --requiredArgumentCount;
        if(argumentCount < requiredArgumentCount)
            sysbvm_error("Missing required argument count.");

        size_t variadicArgumentCount = argumentCount - requiredArgumentCount;
        callFrameStack->gcRoots.applicationArguments[callFrameStack->variadicArgumentIndex] = sysbvm_array_create(context, variadicArgumentCount);
    }
    else
    {
        if(argumentCount != requiredArgumentCount)
            sysbvm_error("Function call does not receive the required number of arguments.");
    }

    if(argumentCount > SYSBVM_MAX_FUNCTION_ARGUMENTS && !callFrameStack->isVariadic)
        sysbvm_error("Function application direct arguments exceeds the max argument count.");
    
}